

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O1

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  DecodeStatus DVar8;
  uint8_t *orig_p;
  uint *puVar9;
  byte bVar10;
  void *Decoder;
  uint64_t Address;
  uint64_t Value;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint64_t Value_4;
  uint uVar15;
  uint uVar16;
  _Bool _Var17;
  code *DecodeRD;
  uint uVar18;
  uint8_t *orig_p_2;
  uint8_t *puVar19;
  byte *pbVar20;
  uint uVar21;
  uint uVar22;
  DecodeStatus S;
  int local_44;
  uint uVar3;
  
  if (3 < code_len) {
    uVar22 = *(uint *)code;
    uVar2 = uVar22 >> 0x18;
    uVar4 = (uVar22 & 0xff0000) >> 8;
    uVar3 = uVar2 | uVar4;
    uVar5 = (uVar22 & 0xff00) << 8;
    uVar16 = uVar3 | uVar5;
    uVar22 = uVar22 << 0x18;
    uVar21 = uVar16 | uVar22;
    __s = MI->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
    }
    uVar15 = 0;
    local_44 = 3;
    puVar7 = DecoderTableSparc32;
LAB_001aae82:
    puVar19 = puVar7;
    switch(*puVar19) {
    case '\x01':
      uVar15 = ~(-1 << (puVar19[2] & 0x1f)) << (puVar19[1] & 0x1f);
      if (puVar19[2] == 0x20) {
        uVar15 = 0xffffffff;
      }
      uVar15 = (uVar15 & uVar21) >> (puVar19[1] & 0x1f);
      puVar7 = puVar19 + 3;
      goto LAB_001aae82;
    case '\x02':
      uVar11 = 0;
      uVar13 = 0;
      bVar10 = 0;
      do {
        lVar6 = uVar11 + 1;
        uVar13 = uVar13 + ((puVar19[lVar6] & 0x7f) << (bVar10 & 0x1f));
        bVar10 = bVar10 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar19[lVar6] < '\0');
      puVar7 = puVar19 + (uVar11 & 0xffffffff) + 3;
      if (uVar15 != uVar13) {
        puVar7 = puVar19 + (uVar11 & 0xffffffff) + 3 +
                 *(ushort *)(puVar19 + (uVar11 & 0xffffffff) + 1);
      }
      goto LAB_001aae82;
    case '\x03':
      uVar13 = ~(-1 << (puVar19[2] & 0x1f)) << (puVar19[1] & 0x1f);
      if (puVar19[2] == 0x20) {
        uVar13 = 0xffffffff;
      }
      uVar11 = 0;
      uVar18 = 0;
      bVar10 = 0;
      do {
        lVar6 = uVar11 + 3;
        uVar18 = uVar18 + ((puVar19[lVar6] & 0x7f) << (bVar10 & 0x1f));
        bVar10 = bVar10 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar19[lVar6] < '\0');
      puVar7 = puVar19 + (uVar11 & 0xffffffff) + 5;
      if ((uVar13 & uVar21) >> (puVar19[1] & 0x1f) != uVar18) {
        puVar7 = puVar19 + (uVar11 & 0xffffffff) + 5 +
                 *(ushort *)(puVar19 + (uVar11 & 0xffffffff) + 3);
      }
      goto LAB_001aae82;
    case '\x04':
      uVar11 = 0;
      do {
        lVar6 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while ((char)puVar19[lVar6] < '\0');
      puVar7 = puVar19 + (uVar11 & 0xffffffff) + 3;
      goto LAB_001aae82;
    case '\x05':
      goto switchD_001aae98_caseD_5;
    case '\x06':
      uVar11 = 0;
      uVar13 = 0;
      bVar10 = 0;
      do {
        lVar6 = uVar11 + 1;
        uVar13 = uVar13 + ((puVar19[lVar6] & 0x7f) << (bVar10 & 0x1f));
        bVar10 = bVar10 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar19[lVar6] < '\0');
      uVar12 = 0;
      uVar18 = 0;
      bVar10 = 0;
      do {
        lVar6 = uVar12 + (uVar11 & 0xffffffff) + 1;
        uVar18 = uVar18 + ((puVar19[lVar6] & 0x7f) << (bVar10 & 0x1f));
        bVar10 = bVar10 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar19[lVar6] < '\0');
      puVar7 = puVar19 + (uVar12 & 0xffffffff) + (uVar11 & 0xffffffff) + 1;
      if ((uVar18 & ~uVar21) != 0 || (uVar13 & uVar21) != 0) {
        local_44 = 1;
      }
      goto LAB_001aae82;
    default:
      goto switchD_001aae98_default;
    }
  }
  goto LAB_001abadd;
switchD_001aae98_caseD_5:
  uVar11 = 0;
  uVar15 = 0;
  bVar10 = 0;
  do {
    lVar6 = uVar11 + 1;
    uVar15 = uVar15 + ((puVar19[lVar6] & 0x7f) << (bVar10 & 0x1f));
    bVar10 = bVar10 + 7;
    uVar11 = uVar11 + 1;
  } while ((char)puVar19[lVar6] < '\0');
  pbVar20 = puVar19 + (uVar11 & 0xffffffff) + 1;
  iVar14 = 0;
  bVar10 = 0;
  do {
    bVar1 = *pbVar20;
    iVar14 = iVar14 + ((bVar1 & 0x7f) << (bVar10 & 0x1f));
    bVar10 = bVar10 + 7;
    pbVar20 = pbVar20 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,uVar15);
  if (0x45 < iVar14 - 1U) {
    uVar11 = (ulong)(uVar3 | uVar5 & 0x3fffff);
    goto LAB_001aba77;
  }
  Decoder = (void *)((long)&switchD_001ab078::switchdataD_002521a8 +
                    (long)(int)(&switchD_001ab078::switchdataD_002521a8)[iVar14 - 1U]);
  switch(iVar14) {
  case 1:
    uVar5 = uVar5 & 0x7ffff;
    goto LAB_001ab484;
  case 2:
    uVar5 = uVar5 & 0x3fffff;
LAB_001ab484:
    uVar11 = (ulong)(uVar3 | uVar5);
LAB_001ab489:
    MCOperand_CreateImm0(MI,uVar11);
    uVar22 = uVar22 >> 0x19;
LAB_001ab75b:
    uVar11 = (ulong)(uVar22 & 0xf);
    break;
  case 3:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)((uVar5 & 0x300000) >> 6 | uVar2 | uVar4 & 0x3fff);
    break;
  case 4:
    goto switchD_001ab078_caseD_4;
  case 5:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    uVar11 = (ulong)(uVar3 | uVar5 & 0x3fffff);
    break;
  case 6:
    MCOperand_CreateImm0(MI,(ulong)(uVar3 | uVar5 & 0x7ffff));
    MCOperand_CreateImm0(MI,(ulong)(uVar22 >> 0x19 & 0xf));
    uVar22 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar5 & 0x300000) >> 0x12));
    goto LAB_001abac0;
  case 7:
    uVar11 = (ulong)(uVar21 << 2);
    break;
  default:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_001ab950;
  case 9:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0xb:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)(uVar2 | uVar4 & 0x1fff);
    break;
  case 0xc:
    uVar21 = uVar21 >> 0xc;
    goto LAB_001ab3c8;
  case 0xd:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0xf:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)(uVar2 & 0x3f);
    break;
  case 0x10:
    uVar11 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0x11:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_001ab6ed;
  case 0x12:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_001ab8e8;
  case 0x13:
    uVar22 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
    uVar16 = uVar22;
    goto LAB_001ab737;
  case 0x14:
    uVar22 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
    MCOperand_CreateReg0(MI,uVar22);
    uVar16 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
LAB_001ab737:
    MCOperand_CreateReg0(MI,uVar16);
    MCOperand_CreateImm0(MI,(ulong)(uVar2 | uVar4 & 0x7ff));
    MCOperand_CreateReg0(MI,uVar22);
    uVar22 = uVar21 >> 0xe;
    goto LAB_001ab75b;
  case 0x15:
  case 0x2f:
    uVar21 = uVar21 >> 0x17;
LAB_001ab3c8:
    uVar11 = (ulong)(uVar21 & 0x7c);
    puVar9 = IntRegDecoderTable;
    goto LAB_001ab84c;
  case 0x16:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)(uVar2 | uVar4 & 0x3ff);
    break;
  case 0x17:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab84c;
  case 0x18:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_001ab84c:
    uVar22 = *(uint *)(uVar11 + (long)puVar9);
    goto LAB_001abaad;
  case 0x19:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    iVar14 = 0;
    if ((0xccccccccU >> uVar22 & 1) == 0) {
      uVar22 = QFPRegDecoderTable[uVar22];
LAB_001aba1d:
      MCOperand_CreateReg0(MI,uVar22);
      iVar14 = 0;
      if ((0xccccccccU >> (uVar2 & 0x1f) & 1) == 0) {
        uVar22 = QFPRegDecoderTable[uVar2 & 0x1f];
        goto LAB_001abac0;
      }
    }
    goto LAB_001abaca;
  case 0x1a:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab950;
  case 0x1b:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_001ab950:
    MCOperand_CreateReg0(MI,*(uint *)(uVar11 + (long)puVar9));
    uVar11 = (ulong)((uVar16 & 0x7c000) >> 0xc);
LAB_001abaaa:
    uVar22 = *(uint *)(uVar11 + (long)puVar9);
LAB_001abaad:
    MCOperand_CreateReg0(MI,uVar22);
    uVar22 = puVar9[uVar2 & 0x1f];
    goto LAB_001abac0;
  case 0x1c:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    iVar14 = 0;
    if ((0xccccccccU >> uVar22 & 1) == 0) {
      MCOperand_CreateReg0(MI,QFPRegDecoderTable[uVar22]);
joined_r0x001aba0b:
      uVar22 = (uVar16 & 0x7c000) >> 0xe;
      iVar14 = 0;
      if ((0xccccccccU >> uVar22 & 1) == 0) {
        uVar22 = QFPRegDecoderTable[uVar22];
        goto LAB_001aba1d;
      }
    }
    goto LAB_001abaca;
  case 0x1d:
    uVar22 = *(uint *)((long)DFPRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
    goto LAB_001ab8b6;
  case 0x1e:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar22 & 1) == 0) {
      puVar9 = QFPRegDecoderTable;
LAB_001aba8a:
      uVar22 = puVar9[uVar22];
      goto LAB_001aba8d;
    }
    goto switchD_001aae98_default;
  case 0x1f:
    uVar22 = *(uint *)((long)DFPRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
LAB_001ab4ad:
    MCOperand_CreateReg0(MI,uVar22);
    uVar11 = (ulong)(uVar2 & 0x1f);
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab999;
  case 0x20:
    puVar9 = DFPRegDecoderTable;
    goto LAB_001ab658;
  case 0x21:
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab29c;
  case 0x22:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar22 & 1) != 0) goto switchD_001aae98_default;
    uVar22 = QFPRegDecoderTable[uVar22];
    goto LAB_001ab29f;
  case 0x23:
    puVar9 = FPRegDecoderTable;
LAB_001ab658:
    MCOperand_CreateReg0(MI,*(uint *)((ulong)((uVar22 & 0x3e000000) >> 0x17) + (long)puVar9));
    uVar11 = (ulong)(uVar2 & 0x1f);
    if ((0xccccccccU >> (uVar2 & 0x1f) & 1) == 0) {
      puVar9 = QFPRegDecoderTable;
      goto LAB_001ab999;
    }
    goto switchD_001aae98_default;
  case 0x24:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar22 & 1) == 0) {
      uVar22 = QFPRegDecoderTable[uVar22];
      goto LAB_001ab4ad;
    }
    goto switchD_001aae98_default;
  case 0x25:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab6ed;
  case 0x26:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_001ab8e8;
  case 0x27:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_001ab6ed:
    uVar22 = *(uint *)(uVar11 + (long)puVar9);
    uVar16 = uVar22;
LAB_001ab910:
    MCOperand_CreateReg0(MI,uVar16);
    uVar16 = puVar9[uVar2 & 0x1f];
LAB_001ab91e:
    MCOperand_CreateReg0(MI,uVar16);
    MCOperand_CreateReg0(MI,uVar22);
    uVar22 = uVar21 >> 0xe;
LAB_001ab934:
    uVar11 = (ulong)(uVar22 & 0xf);
    break;
  case 0x28:
    uVar11 = (ulong)((uVar22 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_001ab8e8:
    uVar22 = *(uint *)(uVar11 + (long)puVar9);
    MCOperand_CreateReg0(MI,uVar22);
    uVar16 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
    goto LAB_001ab910;
  case 0x29:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    iVar14 = 0;
    if ((0xccccccccU >> uVar22 & 1) != 0) goto LAB_001abaca;
    uVar22 = QFPRegDecoderTable[uVar22];
    uVar16 = uVar22;
LAB_001ab7ec:
    MCOperand_CreateReg0(MI,uVar16);
    iVar14 = 0;
    if ((0xccccccccU >> (uVar2 & 0x1f) & 1) != 0) goto LAB_001abaca;
    uVar16 = QFPRegDecoderTable[uVar2 & 0x1f];
    goto LAB_001ab91e;
  case 0x2a:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    iVar14 = 0;
    if ((0xccccccccU >> uVar22 & 1) == 0) {
      uVar22 = QFPRegDecoderTable[uVar22];
      MCOperand_CreateReg0(MI,uVar22);
      uVar16 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
      goto LAB_001ab7ec;
    }
    goto LAB_001abaca;
  case 0x2b:
    puVar9 = FPRegDecoderTable;
    MCOperand_CreateReg0
              (MI,*(uint *)((long)FPRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    uVar22 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc));
    goto LAB_001abaad;
  case 0x2c:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    if (3 < uVar22) goto switchD_001aae98_default;
    uVar22 = FCCRegDecoderTable[uVar22];
LAB_001ab8b6:
    MCOperand_CreateReg0(MI,uVar22);
    uVar11 = (ulong)((uVar16 & 0x7c000) >> 0xc);
    puVar9 = FPRegDecoderTable;
    goto LAB_001abaaa;
  case 0x2d:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    if (uVar22 < 4) {
      puVar9 = FCCRegDecoderTable;
      goto LAB_001aba8a;
    }
switchD_001aae98_default:
    iVar14 = 0;
    goto LAB_001abaca;
  case 0x2e:
    uVar22 = uVar22 >> 0x19 & 0x1f;
    iVar14 = 0;
    if (uVar22 < 4) {
      MCOperand_CreateReg0(MI,FCCRegDecoderTable[uVar22]);
      goto joined_r0x001aba0b;
    }
    goto LAB_001abaca;
  case 0x30:
    uVar22 = IntRegDecoderTable[uVar2 & 0x1f];
    goto LAB_001abac0;
  case 0x31:
    uVar22 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
LAB_001aba8d:
    MCOperand_CreateReg0(MI,uVar22);
    uVar11 = (ulong)((uVar16 & 0x7c000) >> 0xc);
    puVar9 = DFPRegDecoderTable;
    goto LAB_001abaaa;
  case 0x32:
    puVar9 = DFPRegDecoderTable;
    goto LAB_001ab378;
  case 0x33:
    puVar9 = FPRegDecoderTable;
LAB_001ab378:
    uVar22 = *(uint *)((ulong)((uVar22 & 0x3e000000) >> 0x17) + (long)puVar9);
    MCOperand_CreateReg0(MI,uVar22);
    goto LAB_001abac0;
  case 0x34:
    puVar9 = DFPRegDecoderTable;
    goto LAB_001aba4d;
  case 0x35:
    puVar9 = FPRegDecoderTable;
LAB_001aba4d:
    MCOperand_CreateReg0(MI,*(uint *)((ulong)((uVar22 & 0x3e000000) >> 0x17) + (long)puVar9));
    uVar22 = *(uint *)((ulong)((uVar16 & 0x7c000) >> 0xc) + (long)puVar9);
    goto LAB_001abac0;
  case 0x36:
    puVar9 = IntRegDecoderTable;
LAB_001ab29c:
    uVar22 = *(uint *)((ulong)((uVar22 & 0x3e000000) >> 0x17) + (long)puVar9);
LAB_001ab29f:
    MCOperand_CreateReg0(MI,uVar22);
    uVar11 = (ulong)(uVar2 & 0x1f);
    puVar9 = DFPRegDecoderTable;
    goto LAB_001ab999;
  case 0x37:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)DFPRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17)));
    uVar11 = (ulong)(uVar2 & 0x1f);
    puVar9 = IntRegDecoderTable;
LAB_001ab999:
    uVar22 = puVar9[uVar11];
    goto LAB_001abac0;
  case 0x38:
    DVar8 = DecodeJMPL(MI,uVar21,Address,Decoder);
    goto LAB_001ab82c;
  case 0x39:
    DVar8 = DecodeReturn(MI,uVar21,Address,Decoder);
    goto LAB_001ab82c;
  case 0x3a:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[uVar2 & 0x1f]);
    uVar22 = uVar22 >> 0x19;
    goto LAB_001ab934;
  case 0x3b:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    uVar11 = (ulong)uVar21 & 0xff;
    goto LAB_001ab489;
  case 0x3c:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_001ab811;
  case 0x3d:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_001ab575;
  case 0x3e:
    DVar8 = DecodeSWAP(MI,uVar21,Address,Decoder);
    goto LAB_001ab82c;
  case 0x3f:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_001ab811;
  case 0x40:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_001ab811;
  case 0x41:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_001ab811:
    _Var17 = true;
LAB_001ab827:
    DVar8 = DecodeMem(MI,uVar21,address,info,_Var17,DecodeRD);
LAB_001ab82c:
    iVar14 = local_44;
    if (DVar8 == MCDisassembler_Fail) {
      iVar14 = 0;
    }
    goto LAB_001abaca;
  case 0x42:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_001ab575;
  case 0x43:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_001ab575;
  case 0x44:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_001ab575:
    _Var17 = false;
    goto LAB_001ab827;
  case 0x45:
  case 0x46:
    uVar22 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar22 & 0x3e000000) >> 0x17));
    MCOperand_CreateReg0(MI,uVar22);
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar16 & 0x7c000) >> 0xc)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[uVar2 & 0x1f]);
LAB_001abac0:
    MCOperand_CreateReg0(MI,uVar22);
    goto switchD_001ab078_caseD_4;
  }
LAB_001aba77:
  MCOperand_CreateImm0(MI,uVar11);
switchD_001ab078_caseD_4:
  iVar14 = local_44;
LAB_001abaca:
  if (iVar14 == 0) {
LAB_001abadd:
    _Var17 = false;
  }
  else {
    *size = 4;
    _Var17 = true;
  }
  return _Var17;
}

Assistant:

bool Sparc_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint32_t Insn;
	DecodeStatus Result;
	
	Result = readInstruction32(code, code_len, &Insn);
	if (Result == MCDisassembler_Fail)
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = decodeInstruction_4(DecoderTableSparc32, MI, Insn, address,
			(MCRegisterInfo *)info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}